

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyReadTable
              (Scl_Tree_t *p,Vec_Str_t *vOut,Scl_Item_t *pTiming,char *pName,Vec_Ptr_t *vTemples)

{
  Scl_Pair_t SVar1;
  int iVar2;
  int iVar3;
  Scl_Item_t *pSVar4;
  char *pcVar5;
  char *__s2;
  Vec_Flt_t *pVVar6;
  Vec_Flt_t *pVVar7;
  Vec_Flt_t *p_00;
  Vec_Flt_t *pVVar8;
  void *pvVar9;
  uint i;
  int *piVar10;
  bool bVar11;
  float fVar12;
  Vec_Flt_t *local_68;
  Vec_Flt_t *local_48;
  Vec_Flt_t *local_40;
  Vec_Flt_t *local_38;
  
  piVar10 = &pTiming->Child;
  while( true ) {
    pSVar4 = Scl_LibertyItem(p,*piVar10);
    if (pSVar4 == (Scl_Item_t *)0x0) {
      return 0;
    }
    iVar2 = Scl_LibertyCompare(p,pSVar4->Key,pName);
    if (iVar2 == 0) break;
    piVar10 = &pSVar4->Next;
  }
  pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
  if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
    piVar10 = &pSVar4->Child;
    pVVar7 = (Vec_Flt_t *)0x0;
    pVVar8 = (Vec_Flt_t *)0x0;
    pVVar6 = (Vec_Flt_t *)0x0;
    while (pSVar4 = Scl_LibertyItem(p,*piVar10), pSVar4 != (Scl_Item_t *)0x0) {
      SVar1 = pSVar4->Key;
      iVar2 = Scl_LibertyCompare(p,SVar1,"index_1");
      if (iVar2 == 0) {
        if (pVVar7 != (Vec_Flt_t *)0x0) {
          __assert_fail("vIndex1 == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                        ,0x4d1,
                        "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
        pVVar7 = Scl_LibertyReadFloatVec(pcVar5);
      }
      else {
        iVar2 = Scl_LibertyCompare(p,SVar1,"index_2");
        if (iVar2 == 0) {
          if (pVVar8 != (Vec_Flt_t *)0x0) {
            __assert_fail("vIndex2 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                          ,0x4d3,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
          pVVar8 = Scl_LibertyReadFloatVec(pcVar5);
        }
        else {
          iVar2 = Scl_LibertyCompare(p,SVar1,"values");
          if (iVar2 == 0) {
            if (pVVar6 != (Vec_Flt_t *)0x0) {
              __assert_fail("vValues == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                            ,0x4d5,
                            "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
            pVVar6 = Scl_LibertyReadFloatVec(pcVar5);
          }
        }
      }
      piVar10 = &pSVar4->Next;
    }
    local_48 = pVVar6;
    local_40 = pVVar8;
    local_38 = pVVar7;
    if (((pVVar7 == (Vec_Flt_t *)0x0) || (pVVar8 == (Vec_Flt_t *)0x0)) ||
       (pVVar6 == (Vec_Flt_t *)0x0)) {
      puts("Incomplete table specification");
      return 0;
    }
    Vec_StrPutI_(vOut,pVVar7->nSize);
    for (iVar2 = 0; iVar2 < pVVar7->nSize; iVar2 = iVar2 + 1) {
      fVar12 = Vec_FltEntry(pVVar7,iVar2);
      Vec_StrPutF_(vOut,fVar12);
    }
    Vec_StrPutI_(vOut,pVVar8->nSize);
    for (iVar2 = 0; iVar2 < pVVar8->nSize; iVar2 = iVar2 + 1) {
      fVar12 = Vec_FltEntry(pVVar8,iVar2);
      Vec_StrPutF_(vOut,fVar12);
    }
    iVar2 = pVVar8->nSize * pVVar7->nSize;
    if (iVar2 != pVVar6->nSize) {
      __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                    ,0x4e8,
                    "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                   );
    }
    for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
      fVar12 = Vec_FltEntry(pVVar6,iVar3);
      Vec_StrPutF_(vOut,fVar12);
      iVar2 = pVVar6->nSize;
    }
  }
  else {
    iVar2 = 1;
    while( true ) {
      i = iVar2 - 1;
      if (vTemples->nSize <= (int)i) {
        puts("Template cannot be found in the template library");
        return 0;
      }
      __s2 = (char *)Vec_PtrEntry(vTemples,i);
      if (((i & 3) == 0) && (iVar3 = strcmp(pcVar5,__s2), iVar3 == 0)) break;
      iVar2 = iVar2 + 1;
    }
    piVar10 = &pSVar4->Child;
    pVVar6 = (Vec_Flt_t *)0x0;
    pVVar7 = (Vec_Flt_t *)0x0;
    local_68 = (Vec_Flt_t *)0x0;
    while (pSVar4 = Scl_LibertyItem(p,*piVar10), pSVar4 != (Scl_Item_t *)0x0) {
      SVar1 = pSVar4->Key;
      iVar3 = Scl_LibertyCompare(p,SVar1,"index_1");
      if (iVar3 == 0) {
        if (pVVar6 != (Vec_Flt_t *)0x0) {
          __assert_fail("vIndex1 == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                        ,0x500,
                        "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
        pVVar6 = Scl_LibertyReadFloatVec(pcVar5);
      }
      else {
        iVar3 = Scl_LibertyCompare(p,SVar1,"index_2");
        if (iVar3 == 0) {
          if (pVVar7 != (Vec_Flt_t *)0x0) {
            __assert_fail("vIndex2 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                          ,0x502,
                          "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
          pVVar7 = Scl_LibertyReadFloatVec(pcVar5);
        }
        else {
          iVar3 = Scl_LibertyCompare(p,SVar1,"values");
          if (iVar3 == 0) {
            if (local_68 != (Vec_Flt_t *)0x0) {
              __assert_fail("vValues == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                            ,0x504,
                            "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
            local_68 = Scl_LibertyReadFloatVec(pcVar5);
          }
        }
      }
      piVar10 = &pSVar4->Next;
    }
    local_48 = local_68;
    local_40 = pVVar7;
    local_38 = pVVar6;
    p_00 = (Vec_Flt_t *)Vec_PtrEntry(vTemples,iVar2 + 1);
    pVVar8 = (Vec_Flt_t *)Vec_PtrEntry(vTemples,iVar2 + 2);
    pvVar9 = Vec_PtrEntry(vTemples,iVar2);
    if (pvVar9 == (void *)0x0) {
      if ((pVVar6 != (Vec_Flt_t *)0x0) && (pVVar6->nSize != p_00->nSize)) {
        __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                      ,0x50b,
                      "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      if ((pVVar7 != (Vec_Flt_t *)0x0) &&
         (piVar10 = &pVVar8->nSize, pVVar8 = pVVar7, pVVar7->nSize != *piVar10)) {
        __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                      ,0x50c,
                      "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      if (pVVar6 != (Vec_Flt_t *)0x0) {
        p_00 = pVVar6;
      }
      Vec_StrPutI_(vOut,p_00->nSize);
      for (iVar2 = 0; iVar2 < p_00->nSize; iVar2 = iVar2 + 1) {
        fVar12 = Vec_FltEntry(p_00,iVar2);
        Vec_StrPutF_(vOut,fVar12);
      }
      Vec_StrPutI_(vOut,pVVar8->nSize);
      for (iVar2 = 0; iVar2 < pVVar8->nSize; iVar2 = iVar2 + 1) {
        fVar12 = Vec_FltEntry(pVVar8,iVar2);
        Vec_StrPutF_(vOut,fVar12);
      }
      iVar2 = pVVar8->nSize * p_00->nSize;
      if (iVar2 != local_68->nSize) {
        __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                      ,0x51b,
                      "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
        fVar12 = Vec_FltEntry(local_68,iVar3);
        Vec_StrPutF_(vOut,fVar12);
        iVar2 = local_68->nSize;
      }
    }
    else {
      if ((pVVar7 != (Vec_Flt_t *)0x0) && (pVVar7->nSize != p_00->nSize)) {
        __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                      ,0x525,
                      "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      if ((pVVar6 != (Vec_Flt_t *)0x0) &&
         (piVar10 = &pVVar8->nSize, pVVar8 = pVVar6, pVVar6->nSize != *piVar10)) {
        __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                      ,0x526,
                      "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      if (pVVar7 != (Vec_Flt_t *)0x0) {
        p_00 = pVVar7;
      }
      Vec_StrPutI_(vOut,p_00->nSize);
      for (iVar2 = 0; iVar2 < p_00->nSize; iVar2 = iVar2 + 1) {
        fVar12 = Vec_FltEntry(p_00,iVar2);
        Vec_StrPutF_(vOut,fVar12);
      }
      Vec_StrPutI_(vOut,pVVar8->nSize);
      for (iVar2 = 0; iVar2 < pVVar8->nSize; iVar2 = iVar2 + 1) {
        fVar12 = Vec_FltEntry(pVVar8,iVar2);
        Vec_StrPutF_(vOut,fVar12);
      }
      iVar2 = pVVar8->nSize * p_00->nSize;
      if (iVar2 != local_68->nSize) {
        __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLiberty.c"
                      ,0x535,
                      "int Scl_LibertyReadTable(Scl_Tree_t *, Vec_Str_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
        Vec_FltEntry(local_68,iVar3);
        fVar12 = Vec_FltEntry(local_68,(iVar3 % pVVar8->nSize) * p_00->nSize + iVar3 / pVVar8->nSize
                             );
        Vec_StrPutF_(vOut,fVar12);
        iVar2 = local_68->nSize;
      }
    }
  }
  iVar2 = 3;
  while (bVar11 = iVar2 != 0, iVar2 = iVar2 + -1, bVar11) {
    Vec_StrPutF_(vOut,0.0);
  }
  iVar2 = 4;
  while (bVar11 = iVar2 != 0, iVar2 = iVar2 + -1, bVar11) {
    Vec_StrPutF_(vOut,0.0);
  }
  iVar2 = 6;
  while (bVar11 = iVar2 != 0, iVar2 = iVar2 + -1, bVar11) {
    Vec_StrPutF_(vOut,0.0);
  }
  Vec_FltFreeP(&local_38);
  Vec_FltFreeP(&local_40);
  Vec_FltFreeP(&local_48);
  return 1;
}

Assistant:

int Scl_LibertyReadTable( Scl_Tree_t * p, Vec_Str_t * vOut, Scl_Item_t * pTiming, char * pName, Vec_Ptr_t * vTemples )
{
    Vec_Flt_t * vIndex1 = NULL;
    Vec_Flt_t * vIndex2 = NULL;
    Vec_Flt_t * vValues = NULL;
    Vec_Flt_t * vInd1, * vInd2;
    Scl_Item_t * pItem, * pTable = NULL;
    char * pThis, * pTempl = NULL;
    int iPlace, i;
    float Entry;
    // find the table
    Scl_ItemForEachChildName( p, pTiming, pTable, pName )
        break;
    if ( pTable == NULL )
        return 0;
    // find the template
    pTempl = Scl_LibertyReadString(p, pTable->Head);
    if ( pTempl == NULL || pTempl[0] == 0 )
    {
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        if ( vIndex1 == NULL || vIndex2 == NULL || vValues == NULL )
            { printf( "Incomplete table specification\n" ); return 0; }
        // dump the table
        vInd1 = vIndex1;
        vInd2 = vIndex2;
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
        Vec_FltForEachEntry( vInd1, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        // write entries
        Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
        Vec_FltForEachEntry( vInd2, Entry, i )
            Vec_StrPutF_( vOut, Entry );
        Vec_StrPut_( vOut );
        Vec_StrPut_( vOut );
        // write entries
        assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
        Vec_FltForEachEntry( vValues, Entry, i )
        {
            Vec_StrPutF_( vOut, Entry );
            if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                Vec_StrPut_( vOut );
        }
    }
    else
    {
        // fetch the template
        iPlace = -1;
        Vec_PtrForEachEntry( char *, vTemples, pThis, i )
            if ( i % 4 == 0 && !strcmp(pTempl, pThis) )
            {  
                iPlace = i;
                break;
            }
        if ( iPlace == -1 )
            { printf( "Template cannot be found in the template library\n" ); return 0; }
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        // check the template style
        vInd1 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 2 ); // slew
        vInd2 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 3 ); // load
        if ( Vec_PtrEntry(vTemples, iPlace + 1) == NULL ) // normal order (vIndex1 is slew; vIndex2 is load)
        {
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2) );
            vInd1 = vIndex1 ? vIndex1 : vInd1;
            vInd2 = vIndex2 ? vIndex2 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
        else  // reverse order (vIndex2 is slew; vIndex1 is load)
        {
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1) );
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2) );
            vInd1 = vIndex2 ? vIndex2 : vInd1;
            vInd2 = vIndex1 ? vIndex1 : vInd2;
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd1) );
            Vec_FltForEachEntry( vInd1, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            // write entries
            Vec_StrPutI_( vOut, Vec_FltSize(vInd2) );
            Vec_FltForEachEntry( vInd2, Entry, i )
                Vec_StrPutF_( vOut, Entry );
            Vec_StrPut_( vOut );
            Vec_StrPut_( vOut );
            // write entries -- transpose
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                int x = i % Vec_FltSize(vInd2);
                int y = i / Vec_FltSize(vInd2);
                Entry = Vec_FltEntry( vValues, x * Vec_FltSize(vInd1) + y );
                Vec_StrPutF_( vOut, Entry );
                if ( i % Vec_FltSize(vInd2) == Vec_FltSize(vInd2)-1 )
                    Vec_StrPut_( vOut );
            }
        }
    }
    Vec_StrPut_( vOut );
    for ( i = 0; i < 3; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 4; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    for ( i = 0; i < 6; i++ ) 
        Vec_StrPutF_( vOut, 0 );
    Vec_FltFreeP( &vIndex1 );
    Vec_FltFreeP( &vIndex2 );
    Vec_FltFreeP( &vValues );
    Vec_StrPut_( vOut );
    Vec_StrPut_( vOut );
    return 1;
}